

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

Oop __thiscall
Lodtalk::MethodSemanticAnalysis::visitAssignmentExpression
          (MethodSemanticAnalysis *this,AssignmentExpression *node)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  Node *pNVar2;
  IdentifierExpression *this_01;
  VariableLookupPtr *pVVar3;
  IdentifierExpression *this_02;
  
  pNVar2 = AST::AssignmentExpression::getReference(node);
  (*pNVar2->_vptr_Node[2])(pNVar2,this);
  pNVar2 = AST::AssignmentExpression::getValue(node);
  (*pNVar2->_vptr_Node[2])(pNVar2);
  this_01 = (IdentifierExpression *)AST::AssignmentExpression::getReference(node);
  this_02 = this_01;
  iVar1 = (*(this_01->super_Node)._vptr_Node[4])();
  if ((char)iVar1 == '\0') {
    visitAssignmentExpression();
  }
  else {
    pVVar3 = AST::IdentifierExpression::getVariable(this_01);
    this_02 = (IdentifierExpression *)
              (pVVar3->super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    this_00 = (pVVar3->super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    iVar1 = (*(this_02->super_Node)._vptr_Node[3])();
    if ((char)iVar1 != '\0') {
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      return (Oop)&NilObject;
    }
  }
  AbstractASTVisitor::error
            ((AbstractASTVisitor *)this_02,(Node *)this,
             "cannot perform an assignment into an immutable variable.");
}

Assistant:

Oop MethodSemanticAnalysis::visitAssignmentExpression(AssignmentExpression *node)
{
    // Visit the identifier.
    node->getReference()->acceptVisitor(this);

    // Visit the value.
    node->getValue()->acceptVisitor(this);

    // Ensure the reference is an identifier expression.
    auto reference = node->getReference();
    if(!reference->isIdentifierExpression())
    {
        LODTALK_UNIMPLEMENTED();
    }

    // Ensure the variable is mutable.
    auto identExpr = static_cast<AST::IdentifierExpression*> (reference);
    auto variable = identExpr-> getVariable();
    if(!variable->isMutable())
        error(node, "cannot perform an assignment into an immutable variable.");

    return Oop();
}